

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void VW::parse_example_label(vw *all,example *ec,string *label)

{
  pointer pcVar1;
  substring s;
  v_array<substring> local_38;
  
  local_38.end_array = (substring *)0x0;
  local_38.erase_count = 0;
  local_38._begin = (substring *)0x0;
  local_38._end = (substring *)0x0;
  pcVar1 = (label->_M_dataplus)._M_p;
  s.end = pcVar1 + label->_M_string_length;
  s.begin = pcVar1;
  tokenize<v_array<substring>>(' ',s,&local_38,false);
  (*(all->p->lp).parse_label)(all->p,all->sd,&ec->l,&local_38);
  v_array<substring>::clear(&local_38);
  if (local_38._begin != (substring *)0x0) {
    free(local_38._begin);
  }
  return;
}

Assistant:

void parse_example_label(vw& all, example& ec, string label)
{
  v_array<substring> words = v_init<substring>();
  char* cstr = (char*)label.c_str();
  substring str = {cstr, cstr + label.length()};
  tokenize(' ', str, words);
  all.p->lp.parse_label(all.p, all.sd, &ec.l, words);
  words.clear();
  words.delete_v();
}